

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateStaticVariableInitializers
          (MessageGenerator *this,Printer *printer)

{
  long lVar1;
  Descriptor *pDVar2;
  long lVar3;
  long lVar4;
  MessageGenerator local_58;
  
  pDVar2 = this->descriptor_;
  if (0 < *(int *)(pDVar2 + 0x48)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      lVar1 = *(long *)(pDVar2 + 0x50);
      if ((*(char *)(*(long *)(lVar1 + 0x20 + lVar4) + 0x6b) != '\x01') ||
         (*(int *)(*(long *)(lVar1 + 0x10 + lVar4) + 0x8c) != 3)) {
        local_58.descriptor_ = (Descriptor *)(lVar1 + lVar4);
        local_58.params_ = this->params_;
        FieldGeneratorMap::FieldGeneratorMap
                  (&local_58.field_generators_,local_58.descriptor_,local_58.params_);
        GenerateStaticVariableInitializers(&local_58,printer);
        FieldGeneratorMap::~FieldGeneratorMap(&local_58.field_generators_);
        pDVar2 = this->descriptor_;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xa8;
    } while (lVar3 < *(int *)(pDVar2 + 0x48));
  }
  return;
}

Assistant:

void MessageGenerator::GenerateStaticVariableInitializers(
    io::Printer* printer) {
  // Generate static member initializers for all nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
   // TODO(kenton):  Reuse MessageGenerator objects?
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    MessageGenerator(descriptor_->nested_type(i), params_)
      .GenerateStaticVariableInitializers(printer);
  }
}